

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
Initialize(SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>
           *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->freeObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x18,"(this->freeObjectList == nullptr)","this->freeObjectList == nullptr");
    if (!bVar2) goto LAB_00741554;
    *puVar3 = 0;
  }
  if (this->endAddress != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x19,"(this->endAddress == nullptr)","this->endAddress == nullptr");
    if (!bVar2) goto LAB_00741554;
    *puVar3 = 0;
  }
  if (this->heapBlock != (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x1a,"(this->heapBlock == nullptr)","this->heapBlock == nullptr");
    if (!bVar2) {
LAB_00741554:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->prev = this;
  this->next = this;
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::Initialize()
{
    Assert(this->freeObjectList == nullptr);
    Assert(this->endAddress == nullptr);
    Assert(this->heapBlock == nullptr);

    this->prev = this;
    this->next = this;

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    DebugOnly(this->isAllocatingFromNewBlock = false);
#endif
}